

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O2

bool __thiscall TSDemuxer::checkForRealM2ts(TSDemuxer *this,uint8_t *buffer,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  ostream *poVar4;
  
  puVar3 = buffer;
  do {
    if (end <= puVar3) {
      do {
        if (end <= buffer) {
          return false;
        }
        uVar2 = *buffer;
        buffer = buffer + 0xbc;
      } while (uVar2 == 'G');
      poVar4 = std::operator<<((ostream *)&std::cerr,"Warning! The file ");
      poVar4 = std::operator<<(poVar4,(string *)&this->m_streamName);
      poVar4 = std::operator<<(poVar4," has a M2TS format.");
      std::endl<char,std::char_traits<char>>(poVar4);
      sLastMsg = true;
      return true;
    }
    puVar1 = puVar3 + 4;
    puVar3 = puVar3 + 0xc0;
  } while (*puVar1 == 'G');
  return false;
}

Assistant:

bool TSDemuxer::checkForRealM2ts(const uint8_t* buffer, const uint8_t* end) const
{
    for (const uint8_t* cur = buffer; cur < end; cur += 192)
        if (cur[4] != 0x47)
            return false;
    for (const uint8_t* cur = buffer; cur < end; cur += 188)
        if (*cur != 0x47)
        {
            LTRACE(LT_WARN, 2, "Warning! The file " << m_streamName << " has a M2TS format.");
            return true;
        }
    return false;
}